

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcDec.c
# Opt level: O0

Abc_Obj_t * Lpk_Implement(Lpk_Man_t *pMan,Abc_Ntk_t *pNtk,Vec_Ptr_t *vLeaves,int nLeavesOld)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Lpk_Fun_t *pFun;
  int local_3c;
  int i;
  Abc_Obj_t *pRes;
  Abc_Obj_t *pFanin;
  int nLeavesOld_local;
  Vec_Ptr_t *vLeaves_local;
  Abc_Ntk_t *pNtk_local;
  Lpk_Man_t *pMan_local;
  
  iVar1 = Vec_PtrSize(vLeaves);
  if (iVar1 <= nLeavesOld) {
    __assert_fail("nLeavesOld < Vec_PtrSize(vLeaves)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkAbcDec.c"
                  ,0x7c,"Abc_Obj_t *Lpk_Implement(Lpk_Man_t *, Abc_Ntk_t *, Vec_Ptr_t *, int)");
  }
  for (local_3c = 0; local_3c < nLeavesOld; local_3c = local_3c + 1) {
    pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(vLeaves,local_3c);
    pAVar2 = Abc_ObjNot(pAVar2);
    Vec_PtrWriteEntry(vLeaves,local_3c,pAVar2);
  }
  pFun = (Lpk_Fun_t *)Vec_PtrEntry(vLeaves,nLeavesOld);
  pAVar2 = Lpk_Implement_rec(pMan,pNtk,vLeaves,pFun);
  Vec_PtrShrink(vLeaves,nLeavesOld);
  return pAVar2;
}

Assistant:

Abc_Obj_t * Lpk_Implement( Lpk_Man_t * pMan, Abc_Ntk_t * pNtk, Vec_Ptr_t * vLeaves, int nLeavesOld )
{
    Abc_Obj_t * pFanin, * pRes;
    int i;
    assert( nLeavesOld < Vec_PtrSize(vLeaves) );
    // mark implemented nodes
    Vec_PtrForEachEntryStop( Abc_Obj_t *, vLeaves, pFanin, i, nLeavesOld )
        Vec_PtrWriteEntry( vLeaves, i, Abc_ObjNot(pFanin) );
    // recursively construct starting from the first entry
    pRes = Lpk_Implement_rec( pMan, pNtk, vLeaves, (Lpk_Fun_t *)Vec_PtrEntry( vLeaves, nLeavesOld ) );
    Vec_PtrShrink( vLeaves, nLeavesOld );
    return pRes;
}